

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

uint64_t __thiscall
RandomMixin<FastRandomContext>::randbits(RandomMixin<FastRandomContext> *this,int bits)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  int in_ESI;
  ulong *in_RDI;
  long in_FS_OFFSET;
  uint64_t gen;
  uint64_t ret;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  FastRandomContext *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint64_t local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<false,bool>
            ((bool *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),(char *)in_stack_ffffffffffffffd0,
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(char *)in_RDI,
             (char *)in_stack_ffffffffffffffb8);
  if (in_ESI == 0x40) {
    Impl(in_stack_ffffffffffffffb8);
    local_18 = FastRandomContext::rand64(in_stack_ffffffffffffffd0);
  }
  else {
    if ((int)in_RDI[1] < in_ESI) {
      Impl(in_stack_ffffffffffffffb8);
      uVar2 = FastRandomContext::rand64(in_stack_ffffffffffffffd0);
      uVar3 = uVar2 << ((byte)(int)in_RDI[1] & 0x3f) | *in_RDI;
      *in_RDI = uVar2 >> ((char)in_ESI - (char)(int)in_RDI[1] & 0x3fU);
      *(int *)(in_RDI + 1) = ((int)in_RDI[1] + 0x40) - in_ESI;
    }
    else {
      uVar3 = *in_RDI;
      *in_RDI = *in_RDI >> ((byte)in_ESI & 0x3f);
      *(int *)(in_RDI + 1) = (int)in_RDI[1] - in_ESI;
    }
    local_18 = uVar3 & (1L << ((byte)in_ESI & 0x3f)) - 1U;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t randbits(int bits) noexcept
    {
        Assume(bits <= 64);
        // Requests for the full 64 bits are passed through.
        if (bits == 64) return Impl().rand64();
        uint64_t ret;
        if (bits <= bitbuf_size) {
            // If there is enough entropy left in bitbuf, return its bottom bits bits.
            ret = bitbuf;
            bitbuf >>= bits;
            bitbuf_size -= bits;
        } else {
            // If not, return all of bitbuf, supplemented with the (bits - bitbuf_size) bottom
            // bits of a newly generated 64-bit number on top. The remainder of that generated
            // number becomes the new bitbuf.
            uint64_t gen = Impl().rand64();
            ret = (gen << bitbuf_size) | bitbuf;
            bitbuf = gen >> (bits - bitbuf_size);
            bitbuf_size = 64 + bitbuf_size - bits;
        }
        // Return the bottom bits bits of ret.
        return ret & ((uint64_t{1} << bits) - 1);
    }